

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

Vec_Ptr_t * Bac_PtrTransformBox(Vec_Ptr_t *vBox,Vec_Ptr_t *vGatesNames)

{
  int iVar1;
  Vec_Ptr_t *p;
  char *pcVar2;
  Vec_Ptr_t *vNew;
  int i;
  char *pName;
  Vec_Ptr_t *vGatesNames_local;
  Vec_Ptr_t *vBox_local;
  
  iVar1 = Vec_PtrSize(vBox);
  p = Vec_PtrAllocExact(iVar1);
  for (vNew._4_4_ = 0; iVar1 = Vec_PtrSize(vBox), vNew._4_4_ < iVar1; vNew._4_4_ = vNew._4_4_ + 1) {
    pcVar2 = (char *)Vec_PtrEntry(vBox,vNew._4_4_);
    pcVar2 = Abc_UtilStrsav(pcVar2);
    Vec_PtrPush(p,pcVar2);
  }
  if (vGatesNames != (Vec_Ptr_t *)0x0) {
    Bac_PtrUpdateBox(p,vGatesNames);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformBox( Vec_Ptr_t * vBox, Vec_Ptr_t * vGatesNames )
{
    char * pName; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vBox) );
    Vec_PtrForEachEntry( char *, vBox, pName, i )
        Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    if ( vGatesNames )
        Bac_PtrUpdateBox( vNew, vGatesNames );
    return vNew;
}